

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellANCF_3833::GetStateBlock
          (ChElementShellANCF_3833 *this,ChVectorDynamic<> *mD)

{
  double *pdVar1;
  long lVar2;
  pointer psVar3;
  element_type *peVar4;
  double *pdVar5;
  Index index_23;
  ulong uVar6;
  uint uVar7;
  Index index_1;
  ulong uVar8;
  
  lVar2 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (lVar2 < 3) goto LAB_00741530;
  psVar3 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzDD>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pdVar5 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  uVar6 = 3;
  peVar4 = (psVar3->super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if (((ulong)pdVar5 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar5 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_00740af3;
  }
  else {
LAB_00740af3:
    uVar8 = 0;
    do {
      pdVar5[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar8 * 8 + 0x20);
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if (uVar6 < 3) {
    do {
      pdVar5[uVar6] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar6 * 8 + 0x20);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  if (lVar2 < 6) goto LAB_00741530;
  pdVar1 = pdVar5 + 3;
  uVar6 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_00740b5a;
  }
  else {
LAB_00740b5a:
    uVar8 = 0;
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar8 * 8 + 0xf0);
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if (uVar6 < 3) {
    do {
      pdVar1[uVar6] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar6 * 8 + 0xf0);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  if (lVar2 < 9) goto LAB_00741530;
  pdVar1 = pdVar5 + 6;
  uVar6 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_00740bc9;
  }
  else {
LAB_00740bc9:
    uVar8 = 0;
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->DD_dt + uVar8 * 8 + 0xffffffffffffffe8);
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if (uVar6 < 3) {
    do {
      pdVar1[uVar6] = *(double *)((long)&peVar4->DD_dt + uVar6 * 8 + 0xffffffffffffffe8);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  if (lVar2 < 0xc) goto LAB_00741530;
  peVar4 = psVar3[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pdVar1 = pdVar5 + 9;
  uVar6 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_00740c3c;
  }
  else {
LAB_00740c3c:
    uVar8 = 0;
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar8 * 8 + 0x20);
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if (uVar6 < 3) {
    do {
      pdVar1[uVar6] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar6 * 8 + 0x20);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  if (lVar2 < 0xf) goto LAB_00741530;
  pdVar1 = pdVar5 + 0xc;
  uVar6 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_00740ca5;
  }
  else {
LAB_00740ca5:
    uVar8 = 0;
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar8 * 8 + 0xf0);
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if (uVar6 < 3) {
    do {
      pdVar1[uVar6] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar6 * 8 + 0xf0);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  if (lVar2 < 0x12) goto LAB_00741530;
  pdVar1 = pdVar5 + 0xf;
  uVar6 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_00740d14;
  }
  else {
LAB_00740d14:
    uVar8 = 0;
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->DD_dt + uVar8 * 8 + 0xffffffffffffffe8);
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if (uVar6 < 3) {
    do {
      pdVar1[uVar6] = *(double *)((long)&peVar4->DD_dt + uVar6 * 8 + 0xffffffffffffffe8);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  if (lVar2 < 0x15) goto LAB_00741530;
  peVar4 = psVar3[2].super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pdVar1 = pdVar5 + 0x12;
  uVar6 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_00740d8a;
  }
  else {
LAB_00740d8a:
    uVar8 = 0;
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar8 * 8 + 0x20);
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if (uVar6 < 3) {
    do {
      pdVar1[uVar6] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar6 * 8 + 0x20);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  if (lVar2 < 0x18) goto LAB_00741530;
  pdVar1 = pdVar5 + 0x15;
  uVar6 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_00740df6;
  }
  else {
LAB_00740df6:
    uVar8 = 0;
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar8 * 8 + 0xf0);
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if (uVar6 < 3) {
    do {
      pdVar1[uVar6] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar6 * 8 + 0xf0);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  if (lVar2 < 0x1b) goto LAB_00741530;
  pdVar1 = pdVar5 + 0x18;
  uVar6 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_00740e68;
  }
  else {
LAB_00740e68:
    uVar8 = 0;
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->DD_dt + uVar8 * 8 + 0xffffffffffffffe8);
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if (uVar6 < 3) {
    do {
      pdVar1[uVar6] = *(double *)((long)&peVar4->DD_dt + uVar6 * 8 + 0xffffffffffffffe8);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  if (lVar2 < 0x1e) goto LAB_00741530;
  peVar4 = psVar3[3].super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pdVar1 = pdVar5 + 0x1b;
  uVar6 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_00740ede;
  }
  else {
LAB_00740ede:
    uVar8 = 0;
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar8 * 8 + 0x20);
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if (uVar6 < 3) {
    do {
      pdVar1[uVar6] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar6 * 8 + 0x20);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  if (lVar2 < 0x21) goto LAB_00741530;
  pdVar1 = pdVar5 + 0x1e;
  uVar6 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_00740f4a;
  }
  else {
LAB_00740f4a:
    uVar8 = 0;
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar8 * 8 + 0xf0);
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if (uVar6 < 3) {
    do {
      pdVar1[uVar6] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar6 * 8 + 0xf0);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  if (lVar2 < 0x24) goto LAB_00741530;
  pdVar1 = pdVar5 + 0x21;
  uVar6 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_00740fbc;
  }
  else {
LAB_00740fbc:
    uVar8 = 0;
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->DD_dt + uVar8 * 8 + 0xffffffffffffffe8);
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if (uVar6 < 3) {
    do {
      pdVar1[uVar6] = *(double *)((long)&peVar4->DD_dt + uVar6 * 8 + 0xffffffffffffffe8);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  if (lVar2 < 0x27) goto LAB_00741530;
  peVar4 = psVar3[4].super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pdVar1 = pdVar5 + 0x24;
  uVar6 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_00741032;
  }
  else {
LAB_00741032:
    uVar8 = 0;
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar8 * 8 + 0x20);
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if (uVar6 < 3) {
    do {
      pdVar1[uVar6] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar6 * 8 + 0x20);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  if (lVar2 < 0x2a) goto LAB_00741530;
  pdVar1 = pdVar5 + 0x27;
  uVar6 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_0074109e;
  }
  else {
LAB_0074109e:
    uVar8 = 0;
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar8 * 8 + 0xf0);
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if (uVar6 < 3) {
    do {
      pdVar1[uVar6] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar6 * 8 + 0xf0);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  if (lVar2 < 0x2d) goto LAB_00741530;
  pdVar1 = pdVar5 + 0x2a;
  uVar6 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_00741110;
  }
  else {
LAB_00741110:
    uVar8 = 0;
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->DD_dt + uVar8 * 8 + 0xffffffffffffffe8);
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if (uVar6 < 3) {
    do {
      pdVar1[uVar6] = *(double *)((long)&peVar4->DD_dt + uVar6 * 8 + 0xffffffffffffffe8);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  if (lVar2 < 0x30) goto LAB_00741530;
  peVar4 = psVar3[5].super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pdVar1 = pdVar5 + 0x2d;
  uVar6 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_00741186;
  }
  else {
LAB_00741186:
    uVar8 = 0;
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar8 * 8 + 0x20);
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if (uVar6 < 3) {
    do {
      pdVar1[uVar6] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar6 * 8 + 0x20);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  if (lVar2 < 0x33) goto LAB_00741530;
  pdVar1 = pdVar5 + 0x30;
  uVar6 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_007411f2;
  }
  else {
LAB_007411f2:
    uVar8 = 0;
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar8 * 8 + 0xf0);
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if (uVar6 < 3) {
    do {
      pdVar1[uVar6] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar6 * 8 + 0xf0);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  if (lVar2 < 0x36) goto LAB_00741530;
  pdVar1 = pdVar5 + 0x33;
  uVar6 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_00741264;
  }
  else {
LAB_00741264:
    uVar8 = 0;
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->DD_dt + uVar8 * 8 + 0xffffffffffffffe8);
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if (uVar6 < 3) {
    do {
      pdVar1[uVar6] = *(double *)((long)&peVar4->DD_dt + uVar6 * 8 + 0xffffffffffffffe8);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  if (lVar2 < 0x39) goto LAB_00741530;
  peVar4 = psVar3[6].super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pdVar1 = pdVar5 + 0x36;
  uVar6 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_007412da;
  }
  else {
LAB_007412da:
    uVar8 = 0;
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar8 * 8 + 0x20);
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if (uVar6 < 3) {
    do {
      pdVar1[uVar6] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar6 * 8 + 0x20);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  if (lVar2 < 0x3c) goto LAB_00741530;
  pdVar1 = pdVar5 + 0x39;
  uVar6 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_00741346;
  }
  else {
LAB_00741346:
    uVar8 = 0;
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar8 * 8 + 0xf0);
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if (uVar6 < 3) {
    do {
      pdVar1[uVar6] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar6 * 8 + 0xf0);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  if (lVar2 < 0x3f) goto LAB_00741530;
  pdVar1 = pdVar5 + 0x3c;
  uVar6 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_007413b8;
  }
  else {
LAB_007413b8:
    uVar8 = 0;
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->DD_dt + uVar8 * 8 + 0xffffffffffffffe8);
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if (uVar6 < 3) {
    do {
      pdVar1[uVar6] = *(double *)((long)&peVar4->DD_dt + uVar6 * 8 + 0xffffffffffffffe8);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  if (lVar2 < 0x42) goto LAB_00741530;
  peVar4 = psVar3[7].super___shared_ptr<chrono::fea::ChNodeFEAxyzDD,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pdVar1 = pdVar5 + 0x3f;
  uVar6 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_0074142d;
  }
  else {
LAB_0074142d:
    uVar8 = 0;
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar8 * 8 + 0x20);
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if (uVar6 < 3) {
    do {
      pdVar1[uVar6] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar6 * 8 + 0x20);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  if (lVar2 < 0x45) goto LAB_00741530;
  pdVar1 = pdVar5 + 0x42;
  uVar6 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 != 0) goto LAB_00741496;
  }
  else {
LAB_00741496:
    uVar8 = 0;
    do {
      pdVar1[uVar8] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar8 * 8 + 0xf0);
      uVar8 = uVar8 + 1;
    } while (uVar6 != uVar8);
  }
  if (uVar6 < 3) {
    do {
      pdVar1[uVar6] = *(double *)((long)&peVar4->super_ChNodeFEAxyzD + uVar6 * 8 + 0xf0);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  if (lVar2 < 0x48) {
LAB_00741530:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  pdVar5 = pdVar5 + 0x45;
  uVar6 = 3;
  if (((ulong)pdVar5 & 7) == 0) {
    uVar7 = -((uint)((ulong)pdVar5 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar7 < 3) {
      uVar6 = (ulong)uVar7;
    }
    if (uVar7 == 0) goto LAB_00741511;
  }
  uVar8 = 0;
  do {
    pdVar5[uVar8] = *(double *)((long)&peVar4->DD_dt + uVar8 * 8 + 0xffffffffffffffe8);
    uVar8 = uVar8 + 1;
  } while (uVar6 != uVar8);
LAB_00741511:
  if (uVar6 < 3) {
    do {
      pdVar5[uVar6] = *(double *)((long)&peVar4->DD_dt + uVar6 * 8 + 0xffffffffffffffe8);
      uVar6 = uVar6 + 1;
    } while (uVar6 != 3);
  }
  return;
}

Assistant:

void ChElementShellANCF_3833::GetStateBlock(ChVectorDynamic<>& mD) {
    mD.segment(0, 3) = m_nodes[0]->GetPos().eigen();
    mD.segment(3, 3) = m_nodes[0]->GetD().eigen();
    mD.segment(6, 3) = m_nodes[0]->GetDD().eigen();
    mD.segment(9, 3) = m_nodes[1]->GetPos().eigen();
    mD.segment(12, 3) = m_nodes[1]->GetD().eigen();
    mD.segment(15, 3) = m_nodes[1]->GetDD().eigen();
    mD.segment(18, 3) = m_nodes[2]->GetPos().eigen();
    mD.segment(21, 3) = m_nodes[2]->GetD().eigen();
    mD.segment(24, 3) = m_nodes[2]->GetDD().eigen();
    mD.segment(27, 3) = m_nodes[3]->GetPos().eigen();
    mD.segment(30, 3) = m_nodes[3]->GetD().eigen();
    mD.segment(33, 3) = m_nodes[3]->GetDD().eigen();
    mD.segment(36, 3) = m_nodes[4]->GetPos().eigen();
    mD.segment(39, 3) = m_nodes[4]->GetD().eigen();
    mD.segment(42, 3) = m_nodes[4]->GetDD().eigen();
    mD.segment(45, 3) = m_nodes[5]->GetPos().eigen();
    mD.segment(48, 3) = m_nodes[5]->GetD().eigen();
    mD.segment(51, 3) = m_nodes[5]->GetDD().eigen();
    mD.segment(54, 3) = m_nodes[6]->GetPos().eigen();
    mD.segment(57, 3) = m_nodes[6]->GetD().eigen();
    mD.segment(60, 3) = m_nodes[6]->GetDD().eigen();
    mD.segment(63, 3) = m_nodes[7]->GetPos().eigen();
    mD.segment(66, 3) = m_nodes[7]->GetD().eigen();
    mD.segment(69, 3) = m_nodes[7]->GetDD().eigen();
}